

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeodesicArcIntercept.cpp
# Opt level: O1

int GeoCalcs::GeodesicArcIntercept
              (LLPoint *pt1,double crs1,LLPoint *center,double radius,LLPoint *intPtC1,
              LLPoint *intPtC2,double dTol)

{
  double dVar1;
  LLPoint *pLVar2;
  int iVar3;
  bool bVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar5;
  LLPoint LVar6;
  double dist;
  InverseResult result;
  double distarray [2];
  LLPoint perpPt;
  double dDistFromPt;
  double dCrsFromPt;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  LLPoint local_c8;
  InverseResult local_b8;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  LLPoint *local_70;
  double local_68;
  uint uStack_5c;
  LLPoint *local_58;
  LLPoint local_50;
  double local_40;
  double local_38;
  
  local_e8._8_8_ = local_e8._0_8_;
  local_f8._8_8_ = local_f8._0_8_;
  local_110 = radius;
  local_100 = dTol;
  local_70 = intPtC1;
  local_58 = intPtC2;
  LVar6 = PerpIntercept(pt1,crs1,center,&local_38,&local_40,dTol);
  local_50.longitude = LVar6.longitude;
  local_50.latitude = LVar6.latitude;
  local_b8.azimuth = 0.0;
  local_b8.reverseAzimuth = 0.0;
  local_b8.distance = 0.0;
  DistVincenty(&local_50,center,&local_b8);
  iVar3 = 0;
  if (local_b8.distance <= local_110) {
    if (local_100 <= ABS(local_b8.distance - local_110)) {
      local_d8._0_4_ = SUB84(local_b8.distance,0);
      local_d8._4_4_ = (undefined4)((ulong)local_b8.distance >> 0x20);
      DistVincenty(&local_50,pt1,&local_b8);
      dVar1 = cos((double)CONCAT44(local_d8._4_4_,(undefined4)local_d8) / kSphereRadius);
      dVar1 = ABS(dVar1);
      dVar5 = 0.0;
      if (dVar1 <= 0.0) {
        dVar5 = dVar1;
      }
      iVar3 = 0;
      if (dVar5 * 1e-08 < dVar1) {
        local_108 = local_b8.azimuth;
        local_f8._0_8_ = kSphereRadius;
        local_e8._0_8_ = cos(local_110 / kSphereRadius);
        dVar1 = cos((double)CONCAT44(local_d8._4_4_,(undefined4)local_d8) / kSphereRadius);
        local_118 = acos((double)local_e8._0_8_ / dVar1);
        local_118 = (double)local_f8._0_8_ * local_118;
        LVar6 = DestVincenty(&local_50,local_108,local_118);
        local_c8.longitude = LVar6.longitude;
        local_c8.latitude = LVar6.latitude;
        iVar3 = 0;
        do {
          DistVincenty(center,&local_c8,&local_b8);
          local_98 = local_110 - local_b8.distance;
          uStack_d0 = 0;
          local_f8._0_8_ = local_b8.reverseAzimuth;
          local_88 = local_118;
          local_d8 = local_98;
          DistVincenty(&local_c8,&local_50,&local_b8);
          local_e8._0_8_ = local_b8.azimuth;
          DistVincenty(center,&local_c8,&local_b8);
          local_68 = SignAzimuthDifference(local_b8.azimuth,local_b8.reverseAzimuth);
          uStack_5c = extraout_XMM0_Dd & 0x7fffffff;
          local_68 = ABS(local_68);
          dVar1 = SignAzimuthDifference((double)local_e8._0_8_,(double)local_f8._0_8_);
          dVar1 = (dVar1 + 3.141592653589793) - local_68;
          local_e8._8_4_ = extraout_XMM0_Dc;
          local_e8._0_8_ = dVar1;
          local_e8._12_4_ = extraout_XMM0_Dd_00;
          local_f8._0_8_ = sin(ABS(dVar1));
          dVar1 = cos(ABS(local_d8) / kSphereRadius);
          dVar1 = acos(dVar1 * (double)local_f8._0_8_);
          local_f8._8_4_ = extraout_XMM0_Dc_00;
          local_f8._0_8_ = dVar1;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          dVar1 = sin(dVar1);
          dVar5 = local_d8;
          if (local_100 <= ABS(dVar1)) {
            if (local_100 <= ABS((double)local_f8._0_8_)) {
              local_e8._0_8_ = kSphereRadius;
              local_68 = sin(local_d8 / kSphereRadius);
              dVar1 = sin((double)local_f8._0_8_);
              dVar5 = asin(local_68 / dVar1);
              dVar5 = dVar5 * (double)local_e8._0_8_;
            }
            else {
              dVar5 = cos((double)local_e8._0_8_);
              dVar5 = local_d8 / dVar5;
            }
          }
          local_118 = (double)(~-(ulong)(0.0 < local_d8) & (ulong)-dVar5 |
                              -(ulong)(0.0 < local_d8) & (ulong)dVar5) + local_118;
          LVar6 = DestVincenty(&local_50,local_108,local_118);
          local_c8.longitude = LVar6.longitude;
          local_c8.latitude = LVar6.latitude;
          DistVincenty(center,&local_c8,&local_b8);
          while( true ) {
            local_80 = local_118;
            local_90 = local_110 - local_b8.distance;
            if (ABS(local_90) <= local_100) break;
            FindLinearRoot(&local_88,&local_98,&local_118);
            if (NAN(local_118)) break;
            LVar6 = DestVincenty(&local_50,local_108,local_118);
            local_c8.longitude = LVar6.longitude;
            local_c8.latitude = LVar6.latitude;
            DistVincenty(center,&local_c8,&local_b8);
            local_88 = local_80;
            local_98 = local_90;
          }
          pLVar2 = local_58;
          if (iVar3 == 0) {
            pLVar2 = local_70;
          }
          pLVar2->latitude = local_c8.latitude;
          pLVar2->longitude = local_c8.longitude;
          local_108 = local_108 + 3.141592653589793;
          LVar6 = DestVincenty(&local_50,local_108,local_118);
          local_c8.longitude = LVar6.longitude;
          local_c8.latitude = LVar6.latitude;
          DistVincenty(center,&local_c8,&local_b8);
          bVar4 = iVar3 == 0;
          iVar3 = iVar3 + 1;
        } while (bVar4);
        iVar3 = 2;
      }
    }
    else {
      local_70->latitude = local_50.latitude;
      local_70->longitude = local_50.longitude;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int GeodesicArcIntercept(const LLPoint &pt1, double crs1,
                             const LLPoint &center, double radius,
                             LLPoint &intPtC1, LLPoint &intPtC2, double dTol)
    {
        double dCrsFromPt, dDistFromPt;
        const LLPoint perpPt = PerpIntercept(pt1, crs1, center, dCrsFromPt, dDistFromPt, dTol);

        InverseResult result;
        DistVincenty(perpPt, center, result);

        if (result.distance > radius)
            return 0;

        if (fabs(result.distance - radius) < dTol)
        {
            intPtC1 = perpPt;
            return 1;
        }

        const double perpDist = result.distance;
        DistVincenty(perpPt, pt1, result);

        if (IsApprox(cos(perpDist / kSphereRadius), 0.0, 1e-8))
            return 0;

        double crs = result.azimuth;
        double dist = kSphereRadius * acos(cos(radius / kSphereRadius) / cos(perpDist / kSphereRadius));
        LLPoint pt = DestVincenty(perpPt, crs, dist);

        const int nIntersects = 2;
        for (int i = 0; i < nIntersects; i++)
        {
            DistVincenty(center, pt, result);
            const double rcrs = result.reverseAzimuth;
            const double dErr = radius - result.distance;

            double distarray[2], errarray[2];
            distarray[0] = dist;
            errarray[0] = dErr;

            DistVincenty(pt, perpPt, result);
            const double bcrs = result.azimuth;

            DistVincenty(center, pt, result);
            const double dAngle = fabs(SignAzimuthDifference(result.azimuth, result.reverseAzimuth));
            const double B = fabs(SignAzimuthDifference(bcrs, rcrs) + M_PI - dAngle);
            const double A = acos(sin(B) * cos(fabs(dErr) / kSphereRadius));
            double c;
            if (fabs(sin(A)) < dTol)
                c = dErr;
            else if (fabs(A) < dTol)
                c = dErr / cos(B);
            else
                c = kSphereRadius * asin(sin(dErr / kSphereRadius) / sin(A));

            dist = dErr > 0 ? dist + c : dist - c;
            pt = DestVincenty(perpPt, crs, dist);
            DistVincenty(center, pt, result);
            distarray[1] = dist;
            errarray[1] = radius - result.distance;

            while (fabs(errarray[1]) > dTol)
            {
                FindLinearRoot(distarray, errarray, dist);
                if (std::isnan(dist))
                    break;

                pt = DestVincenty(perpPt, crs, dist);
                DistVincenty(center, pt, result);
                distarray[0] = distarray[1];
                errarray[0] = errarray[1];
                distarray[1] = dist;
                errarray[1] = radius - result.distance;
                
            }

            if (i == 0)
                intPtC1 = pt;
            else if (i == 1)
                intPtC2 = pt;
            else
                break;

            crs += M_PI;
            pt = DestVincenty(perpPt, crs, dist);
            DistVincenty(center, pt, result);
            errarray[0] = radius - result.distance;
        }

        return nIntersects;
    }